

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptorTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSocketAcceptorTests::receivePartialMessageFixture::receivePartialMessageFixture
          (receivePartialMessageFixture *this)

{
  _Ios_Openmode _Var1;
  socket_handle sVar2;
  SocketAcceptor *this_00;
  stringstream local_260 [8];
  stringstream stream;
  allocator<char> local_d1;
  string local_d0 [8];
  string input;
  undefined1 local_a0 [8];
  SessionSettings settings;
  receivePartialMessageFixture *this_local;
  
  settings._136_8_ = this;
  FIX::TestApplication::TestApplication(&this->application);
  FIX::MemoryStoreFactory::MemoryStoreFactory(&this->factory);
  FIX::SessionSettings::SessionSettings((SessionSettings *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,
             "[DEFAULT]\nConnectionType=acceptor\nSocketAcceptPort=5000\nSocketReuseAddress=Y\nSendBufferSize=1024\nReceiveBufferSize=1024\nStartTime=00:00:00\nEndTime=00:00:00\nUseDataDictionary=N\nCheckLatency=N\n[SESSION]\nBeginString=FIX.4.2\nSenderCompID=ISLD\nTargetCompID=TW\n[SESSION]\nBeginString=FIX.4.1\nSenderCompID=ISLD\nTargetCompID=WT\n"
             ,&local_d1);
  std::allocator<char>::~allocator(&local_d1);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_260,local_d0,_Var1);
  FIX::operator>>((istream *)local_260,(SessionSettings *)local_a0);
  this_00 = (SocketAcceptor *)operator_new(0x1a0);
  FIX::SocketAcceptor::SocketAcceptor
            (this_00,(Application *)this,(MessageStoreFactory *)&this->factory,
             (SessionSettings *)local_a0);
  this->object = this_00;
  FIX::Acceptor::poll(0.0);
  sVar2 = FIX::createSocket(5000,"127.0.0.1");
  this->s = sVar2;
  FIX::Acceptor::poll(0.0);
  std::__cxx11::stringstream::~stringstream(local_260);
  std::__cxx11::string::~string(local_d0);
  FIX::SessionSettings::~SessionSettings((SessionSettings *)local_a0);
  return;
}

Assistant:

receivePartialMessageFixture()
  {
    SessionSettings settings;
    std::string input =
      "[DEFAULT]\n"
      "ConnectionType=acceptor\n"
      "SocketAcceptPort=5000\n"
      "SocketReuseAddress=Y\n"
      "SendBufferSize=1024\n"
      "ReceiveBufferSize=1024\n"
      "StartTime=00:00:00\n"
      "EndTime=00:00:00\n"
      "UseDataDictionary=N\n"
      "CheckLatency=N\n"
      "[SESSION]\n"
      "BeginString=FIX.4.2\n"
      "SenderCompID=ISLD\n"
      "TargetCompID=TW\n"
      "[SESSION]\n"
      "BeginString=FIX.4.1\n"
      "SenderCompID=ISLD\n"
      "TargetCompID=WT\n";
    std::stringstream stream( input );
    stream >> settings;

    object = new SocketAcceptor( application, factory, settings );
    object->poll();
    s = createSocket( 5000, "127.0.0.1" );
    object->poll();
  }